

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMMSegment.hpp
# Opt level: O0

bool __thiscall CppJieba::HMMSegment::_loadModel(HMMSegment *this,char *filePath)

{
  bool bVar1;
  char *pcVar2;
  size_type sVar3;
  char *in_RSI;
  long in_RDI;
  double dVar4;
  uint j_1;
  uint i;
  uint j;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tmp2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tmp;
  string line;
  ifstream ifile;
  char *local_418;
  undefined1 in_stack_fffffffffffffbf0;
  undefined1 in_stack_fffffffffffffbf1;
  undefined1 in_stack_fffffffffffffbf2;
  undefined1 in_stack_fffffffffffffbf3;
  undefined1 in_stack_fffffffffffffbf4;
  undefined1 in_stack_fffffffffffffbf5;
  undefined1 in_stack_fffffffffffffbf6;
  undefined1 in_stack_fffffffffffffbf7;
  char *local_3f8;
  string *in_stack_fffffffffffffc28;
  ifstream *in_stack_fffffffffffffc30;
  allocator *paVar5;
  HMMSegment *in_stack_fffffffffffffc38;
  char *local_390;
  allocator local_379;
  string local_378 [16];
  string *in_stack_fffffffffffffc98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffca0;
  uint in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcac;
  string local_350 [39];
  allocator local_329;
  string local_328 [32];
  uint uVar6;
  uint local_300;
  allocator local_2d1;
  string local_2d0 [8];
  EmitProbMap *in_stack_fffffffffffffd38;
  string *in_stack_fffffffffffffd40;
  HMMSegment *in_stack_fffffffffffffd48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_290;
  string local_278 [32];
  undefined1 local_258 [543];
  allocator local_39;
  string local_38 [32];
  char *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/HMMSegment.hpp"
                   ,0x2f);
  if (pcVar2 == (char *)0x0) {
    local_390 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/HMMSegment.hpp";
  }
  else {
    local_390 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/HMMSegment.hpp"
                        ,0x2f);
    local_390 = local_390 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"loadModel [%s] start ...",&local_39);
  Limonp::Logger::LoggingF(1,local_390,200,(string *)local_38,local_18);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::ifstream::ifstream(local_258,local_18,_S_in);
  std::__cxx11::string::string(local_278);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x135024);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x135031);
  bVar1 = _getLine(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2d0," ",&local_2d1);
    Limonp::splitStr((string *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                     in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
    std::__cxx11::string::~string(local_2d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_290);
    if (sVar3 == 4) {
      for (local_300 = 0;
          sVar3 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(&local_290), local_300 < sVar3; local_300 = local_300 + 1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_290,(ulong)local_300);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        dVar4 = atof(pcVar2);
        *(double *)(in_RDI + 0x10 + (ulong)local_300 * 8) = dVar4;
      }
      for (uVar6 = 0; uVar6 < 4; uVar6 = uVar6 + 1) {
        bVar1 = _getLine(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
                         in_stack_fffffffffffffc28);
        if (!bVar1) {
          local_1 = 0;
          goto LAB_001358d6;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_328," ",&local_329);
        Limonp::splitStr((string *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                         in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
        std::__cxx11::string::~string(local_328);
        std::allocator<char>::~allocator((allocator<char> *)&local_329);
        sVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&local_290);
        if (sVar3 != 4) {
          pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/HMMSegment.hpp"
                           ,0x2f);
          if (pcVar2 == (char *)0x0) {
            local_3f8 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/HMMSegment.hpp"
            ;
          }
          else {
            local_3f8 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/HMMSegment.hpp"
                                ,0x2f);
            local_3f8 = local_3f8 + 1;
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_350,"trans_p illegal",(allocator *)&stack0xfffffffffffffcaf);
          Limonp::Logger::LoggingF(3,local_3f8,0xe8,(string *)local_350);
          std::__cxx11::string::~string(local_350);
          std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffcaf);
          local_1 = 0;
          goto LAB_001358d6;
        }
        for (in_stack_fffffffffffffca8 = 0; in_stack_fffffffffffffca8 < 4;
            in_stack_fffffffffffffca8 = in_stack_fffffffffffffca8 + 1) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&local_290,(ulong)in_stack_fffffffffffffca8);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          dVar4 = atof(pcVar2);
          *(double *)(in_RDI + 0x30 + (ulong)uVar6 * 0x20 + (ulong)in_stack_fffffffffffffca8 * 8) =
               dVar4;
        }
      }
      in_stack_fffffffffffffbf7 =
           _getLine(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
      if (((bool)in_stack_fffffffffffffbf7) &&
         (in_stack_fffffffffffffbf6 =
               _loadEmitProb(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
                             in_stack_fffffffffffffd38), (bool)in_stack_fffffffffffffbf6)) {
        in_stack_fffffffffffffbf5 =
             _getLine(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,in_stack_fffffffffffffc28)
        ;
        if (((bool)in_stack_fffffffffffffbf5) &&
           (in_stack_fffffffffffffbf4 =
                 _loadEmitProb(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
                               in_stack_fffffffffffffd38), (bool)in_stack_fffffffffffffbf4)) {
          in_stack_fffffffffffffbf3 =
               _getLine(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
                        in_stack_fffffffffffffc28);
          if (((bool)in_stack_fffffffffffffbf3) &&
             (in_stack_fffffffffffffbf2 =
                   _loadEmitProb(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
                                 in_stack_fffffffffffffd38), (bool)in_stack_fffffffffffffbf2)) {
            in_stack_fffffffffffffbf1 =
                 _getLine(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
                          in_stack_fffffffffffffc28);
            if (((bool)in_stack_fffffffffffffbf1) &&
               (in_stack_fffffffffffffbf0 =
                     _loadEmitProb(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
                                   in_stack_fffffffffffffd38), (bool)in_stack_fffffffffffffbf0)) {
              pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/HMMSegment.hpp"
                               ,0x2f);
              if (pcVar2 == (char *)0x0) {
                local_418 = 
                "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/HMMSegment.hpp"
                ;
              }
              else {
                local_418 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/HMMSegment.hpp"
                                    ,0x2f);
                local_418 = local_418 + 1;
              }
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_378,"loadModel [%s] end.",&local_379);
              Limonp::Logger::LoggingF(1,local_418,0x10a,(string *)local_378,local_18);
              std::__cxx11::string::~string(local_378);
              std::allocator<char>::~allocator((allocator<char> *)&local_379);
              local_1 = 1;
            }
            else {
              local_1 = 0;
            }
          }
          else {
            local_1 = 0;
          }
        }
        else {
          local_1 = 0;
        }
      }
      else {
        local_1 = 0;
      }
    }
    else {
      pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/HMMSegment.hpp"
                       ,0x2f);
      if (pcVar2 == (char *)0x0) {
        pcVar2 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/HMMSegment.hpp"
        ;
      }
      else {
        pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/HMMSegment.hpp"
                         ,0x2f);
        pcVar2 = pcVar2 + 1;
      }
      paVar5 = (allocator *)&stack0xfffffffffffffd07;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&stack0xfffffffffffffd08,"start_p illegal",paVar5);
      Limonp::Logger::LoggingF(3,pcVar2,0xd5,(string *)&stack0xfffffffffffffd08);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd08);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd07);
      local_1 = 0;
    }
  }
  else {
    local_1 = 0;
  }
LAB_001358d6:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT17(in_stack_fffffffffffffbf7,
                        CONCAT16(in_stack_fffffffffffffbf6,
                                 CONCAT15(in_stack_fffffffffffffbf5,
                                          CONCAT14(in_stack_fffffffffffffbf4,
                                                   CONCAT13(in_stack_fffffffffffffbf3,
                                                            CONCAT12(in_stack_fffffffffffffbf2,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffffbf1,
                                                  in_stack_fffffffffffffbf0))))))));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT17(in_stack_fffffffffffffbf7,
                        CONCAT16(in_stack_fffffffffffffbf6,
                                 CONCAT15(in_stack_fffffffffffffbf5,
                                          CONCAT14(in_stack_fffffffffffffbf4,
                                                   CONCAT13(in_stack_fffffffffffffbf3,
                                                            CONCAT12(in_stack_fffffffffffffbf2,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffffbf1,
                                                  in_stack_fffffffffffffbf0))))))));
  std::__cxx11::string::~string(local_278);
  std::ifstream::~ifstream(local_258);
  return (bool)(local_1 & 1);
}

Assistant:

bool _loadModel(const char* const filePath)
            {
                LogInfo("loadModel [%s] start ...", filePath);
                ifstream ifile(filePath);
                string line;
                vector<string> tmp;
                vector<string> tmp2;
                //load _startProb
                if(!_getLine(ifile, line))
                {
                    return false;
                }
                splitStr(line, tmp, " ");
                if(tmp.size() != STATUS_SUM)
                {
                    LogError("start_p illegal");
                    return false;
                }
                for(uint j = 0; j< tmp.size(); j++)
                {
                    _startProb[j] = atof(tmp[j].c_str());
                    //cout<<_startProb[j]<<endl;
                }

                //load _transProb
                for(uint i = 0; i < STATUS_SUM; i++)
                {
                    if(!_getLine(ifile, line))
                    {
                        return false;
                    }
                    splitStr(line, tmp, " ");
                    if(tmp.size() != STATUS_SUM)
                    {
                        LogError("trans_p illegal");
                        return false;
                    }
                    for(uint j =0; j < STATUS_SUM; j++)
                    {
                        _transProb[i][j] = atof(tmp[j].c_str());
                        //cout<<_transProb[i][j]<<endl;
                    }
                }

                //load _emitProbB
                if(!_getLine(ifile, line) || !_loadEmitProb(line, _emitProbB))
                {
                    return false;
                }

                //load _emitProbE
                if(!_getLine(ifile, line) || !_loadEmitProb(line, _emitProbE))
                {
                    return false;
                }

                //load _emitProbM
                if(!_getLine(ifile, line) || !_loadEmitProb(line, _emitProbM))
                {
                    return false;
                }

                //load _emitProbS
                if(!_getLine(ifile, line) || !_loadEmitProb(line, _emitProbS))
                {
                    return false;
                }

                LogInfo("loadModel [%s] end.", filePath);

                return true;
            }